

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswCore.c
# Opt level: O3

void Ssw_ReportOutputs(Aig_Man_t *pAig)

{
  void *pvVar1;
  Aig_Obj_t *pAVar2;
  ulong uVar3;
  char *pcVar4;
  Aig_Man_t *pAVar5;
  long lVar6;
  
  uVar3 = (ulong)(uint)pAig->nTruePos;
  pAVar5 = pAig;
  if (0 < pAig->nTruePos) {
    lVar6 = 0;
    do {
      if (pAig->vCos->nSize <= lVar6) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pcVar4 = "o;# o+& ;#oB a;o& 5;o# o>& o5;#B >&oa Q;o# +Qo& T;o# +To& p;o# p>o& opT;# o";
      if ((long)(int)uVar3 - (long)pAig->nConstrs <= lVar6) {
        pcVar4 = "1tPD cq[:P tqS[ [qS& Sq[Vt Sq[c Sq[lt Sq[: VqlSt[ Squ[ tq[P( tq+[P [qDtP( c";
      }
      pvVar1 = pAig->vCos->pArray[lVar6];
      Abc_Print((int)pAVar5,pcVar4 + 0x4a);
      pAVar2 = *(Aig_Obj_t **)((long)pvVar1 + 8);
      pcVar4 = "0";
      if (pAVar2 != (Aig_Obj_t *)((ulong)pAig->pConst1 ^ 1)) {
        pcVar4 = "X";
      }
      if (pAig->pConst1 == pAVar2) {
        pcVar4 = "1";
      }
      Abc_Print((int)pAVar5,pcVar4);
      lVar6 = lVar6 + 1;
      uVar3 = (ulong)pAig->nTruePos;
    } while (lVar6 < (long)uVar3);
  }
  Abc_Print((int)pAVar5,"\n");
  return;
}

Assistant:

void Ssw_ReportOutputs( Aig_Man_t * pAig )
{
    Aig_Obj_t * pObj;
    int i;
    Saig_ManForEachPo( pAig, pObj, i )
    {
        if ( i < Saig_ManPoNum(pAig)-Saig_ManConstrNum(pAig) )
            Abc_Print( 1, "o" );
        else
            Abc_Print( 1, "c" );
        Ssw_ReportOneOutput( pAig, Aig_ObjChild0(pObj) );
    }
    Abc_Print( 1, "\n" );
}